

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O2

uint64_t aom_mse_wxh_16bit_highbd_avx2
                   (uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (w == 8) {
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    for (lVar1 = 0; auVar5 = auVar6._0_32_, lVar1 < h; lVar1 = lVar1 + 2) {
      auVar9._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + (long)dstride * 2) +
           ZEXT116(1) * *(undefined1 (*) [16])dst;
      auVar9._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + (long)dstride * 2);
      auVar14._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)sstride * 2) +
           ZEXT116(1) * *(undefined1 (*) [16])src;
      auVar14._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)sstride * 2);
      auVar9 = vpsubw_avx2(auVar14,auVar9);
      auVar9 = vpabsw_avx2(auVar9);
      auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar8 = vpunpcklwd_avx2(auVar9,auVar4);
      auVar14 = vpunpckhwd_avx2(auVar9,auVar4);
      auVar9 = vpmaddwd_avx2(auVar8,auVar8);
      auVar14 = vpmaddwd_avx2(auVar14,auVar14);
      auVar13 = vpunpckldq_avx2(auVar9,auVar4);
      auVar8 = vpunpckhdq_avx2(auVar9,auVar4);
      auVar9 = vpunpckldq_avx2(auVar14,auVar4);
      auVar9 = vpaddq_avx2(auVar13,auVar9);
      auVar14 = vpunpckhdq_avx2(auVar14,auVar4);
      auVar5 = vpaddq_avx2(auVar5,auVar8);
      auVar5 = vpaddq_avx2(auVar5,auVar9);
      auVar5 = vpaddq_avx2(auVar5,auVar14);
      auVar6 = ZEXT3264(auVar5);
      src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 4);
      dst = (uint16_t *)(*(undefined1 (*) [16])dst + (long)dstride * 4);
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    lVar1 = (long)sstride;
    lVar3 = (long)dstride;
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    for (lVar2 = 0; auVar5 = auVar6._0_32_, lVar2 < h; lVar2 = lVar2 + 4) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)dst + lVar3 * 6);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)((long)dst + lVar3 * 4);
      auVar7 = vpunpcklqdq_avx(auVar10,auVar7);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)dst + lVar3 * 2);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)dst;
      auVar10 = vpunpcklqdq_avx(auVar15,auVar11);
      auVar8._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar10;
      auVar8._16_16_ = ZEXT116(1) * auVar7;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)((long)src + lVar1 * 6);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)src + lVar1 * 4);
      auVar7 = vpunpcklqdq_avx(auVar16,auVar12);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)src + lVar1 * 2);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)src;
      auVar10 = vpunpcklqdq_avx(auVar18,auVar17);
      auVar13._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar10;
      auVar13._16_16_ = ZEXT116(1) * auVar7;
      auVar9 = vpsubw_avx2(auVar13,auVar8);
      auVar9 = vpabsw_avx2(auVar9);
      auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar8 = vpunpcklwd_avx2(auVar9,auVar4);
      auVar14 = vpunpckhwd_avx2(auVar9,auVar4);
      auVar9 = vpmaddwd_avx2(auVar8,auVar8);
      auVar14 = vpmaddwd_avx2(auVar14,auVar14);
      auVar13 = vpunpckldq_avx2(auVar9,auVar4);
      auVar8 = vpunpckhdq_avx2(auVar9,auVar4);
      auVar9 = vpunpckldq_avx2(auVar14,auVar4);
      auVar9 = vpaddq_avx2(auVar13,auVar9);
      auVar14 = vpunpckhdq_avx2(auVar14,auVar4);
      auVar5 = vpaddq_avx2(auVar5,auVar8);
      auVar5 = vpaddq_avx2(auVar5,auVar9);
      auVar5 = vpaddq_avx2(auVar5,auVar14);
      auVar6 = ZEXT3264(auVar5);
      src = (uint16_t *)((long)src + lVar1 * 8);
      dst = (uint16_t *)((long)dst + lVar3 * 8);
    }
  }
  auVar7 = vpaddq_avx(auVar5._0_16_,auVar5._16_16_);
  auVar10 = vpshufd_avx(auVar7,0xee);
  auVar7 = vpaddq_avx(auVar7,auVar10);
  return auVar7._0_8_;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_avx2(uint16_t *dst, int dstride,
                                       uint16_t *src, int sstride, int w,
                                       int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_highbd_avx2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_highbd_avx2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}